

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O3

uint32 prune_subtrees(dtree_node_t *node)

{
  dtree_node_t *node_00;
  uint32 uVar1;
  uint32 uVar2;
  
  node_00 = node->y;
  if ((node_00 == (dtree_node_t *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    uVar2 = 0;
  }
  else {
    uVar1 = cnt_node(node_00);
    uVar2 = cnt_node(node->n);
    uVar2 = uVar2 + uVar1;
    prune_subtrees(node_00);
    node->y = (dtree_node_str *)0x0;
    prune_subtrees(node->n);
    node->n = (dtree_node_str *)0x0;
  }
  return uVar2;
}

Assistant:

uint32
prune_subtrees(dtree_node_t *node)
{
    uint32 n_pruned;

    if (!IS_LEAF(node)) {
	n_pruned = cnt_node(node->y) + cnt_node(node->n);
	    
	prune_subtrees(node->y); node->y = NULL;
	prune_subtrees(node->n); node->n = NULL;

	return n_pruned;
    }
    else {
	/* it is a leaf node; nothing to do */
	return 0;
    }
}